

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_step(sqlite3_stmt *pStmt)

{
  int *piVar1;
  sqlite3 *db;
  sqlite3 *psVar2;
  sqlite3 *psVar3;
  Btree *p_00;
  Wal *pWVar4;
  uint *puVar5;
  long *plVar6;
  Vdbe *pVVar7;
  Vdbe *pVVar8;
  Vdbe *pVVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Vdbe *p_01;
  ushort uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long *plVar16;
  size_t sVar17;
  undefined8 *puVar18;
  char *pcVar19;
  byte bVar20;
  int iVar21;
  ulong uVar22;
  sqlite3_stmt *psVar23;
  char *pcVar24;
  undefined8 uVar25;
  Mem *p_02;
  char *pcVar26;
  int iVar27;
  ulong uVar28;
  Mem *pMem;
  int iVar29;
  byte *pbVar30;
  int n;
  long lVar31;
  long lVar32;
  Vdbe *p;
  u32 uVar33;
  int local_18c;
  Vdbe *local_160;
  StrAccum local_158 [9];
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    pcVar19 = "API called with NULL prepared statement";
  }
  else {
    db = *(sqlite3 **)pStmt;
    if (db != (sqlite3 *)0x0) {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      pStmt[0xc5] = (sqlite3_stmt)((byte)pStmt[0xc5] & 0xef);
      local_18c = 0;
LAB_00122db2:
      if (*(int *)(pStmt + 0x24) != 0x2df20da3) {
        sqlite3_reset(pStmt);
      }
      psVar2 = *(sqlite3 **)pStmt;
      uVar15 = 7;
      if (psVar2->mallocFailed == '\0') {
        uVar12 = *(ushort *)(pStmt + 0xc5);
        if (-1 < *(int *)(pStmt + 0x34)) {
LAB_00122dea:
          if ((uVar12 & 0xc) != 0) {
            psVar3 = *(sqlite3 **)pStmt;
            bVar20 = 1;
            if ((uVar12 & 0xc) != 4) {
              bVar20 = *(byte *)((long)&psVar3->flags + 3) & 1;
            }
            lVar31 = *(long *)(pStmt + 0x68);
            p_02 = (Mem *)(lVar31 + 0x38);
            releaseMemArray(p_02,8);
            *(undefined8 *)(pStmt + 0xa0) = 0;
            if (*(int *)(pStmt + 0x38) != 7) {
              iVar14 = *(int *)(pStmt + 0x90);
              if (bVar20 == 0) {
                pMem = (Mem *)0x0;
                plVar16 = (long *)0x0;
                uVar28 = 0;
              }
              else {
                lVar32 = *(long *)(pStmt + 0x68);
                pMem = (Mem *)(lVar32 + 0x1f8);
                if ((*(byte *)(lVar32 + 0x200) & 0x10) == 0) {
                  plVar16 = (long *)0x0;
                  uVar28 = 0;
                }
                else {
                  uVar15 = *(int *)(lVar32 + 0x204) >> 3;
                  uVar28 = (ulong)uVar15;
                  plVar16 = *(long **)(lVar32 + 0x208);
                  if (0 < (int)uVar15) {
                    uVar22 = 0;
                    do {
                      iVar14 = iVar14 + *(int *)(plVar16[uVar22] + 8);
                      uVar22 = uVar22 + 1;
                    } while (uVar28 != uVar22);
                  }
                }
              }
LAB_00122f97:
              iVar27 = *(int *)(pStmt + 0x34);
              do {
                *(int *)(pStmt + 0x34) = iVar27 + 1;
                if (iVar14 <= iVar27) {
                  *(undefined4 *)(pStmt + 0x38) = 0;
                  uVar13 = 0x65;
                  goto LAB_0012310b;
                }
                iVar29 = iVar27 - *(int *)(pStmt + 0x90);
                psVar23 = pStmt + 0x88;
                iVar21 = iVar27;
                if (*(int *)(pStmt + 0x90) <= iVar27) {
                  psVar23 = (sqlite3_stmt *)*plVar16;
                  iVar27 = *(int *)(psVar23 + 8);
                  plVar6 = plVar16;
                  iVar21 = iVar29;
                  if (iVar27 <= iVar29) {
                    do {
                      iVar29 = iVar29 - iVar27;
                      psVar23 = (sqlite3_stmt *)plVar6[1];
                      iVar27 = *(int *)(psVar23 + 8);
                      plVar6 = plVar6 + 1;
                      iVar21 = iVar29;
                    } while (iVar27 <= iVar29);
                  }
                }
                pbVar30 = (byte *)((long)iVar21 * 0x18 + *(long *)psVar23);
                if ((bVar20 != 0) && (pbVar30[1] == 0xfc)) {
                  iVar27 = (int)uVar28;
                  if (iVar27 < 1) {
                    uVar22 = 0;
LAB_00123027:
                    if ((int)uVar22 != iVar27) goto LAB_00123094;
                  }
                  else {
                    uVar22 = 0;
                    do {
                      if (plVar16[uVar22] == *(long *)(pbVar30 + 0x10)) goto LAB_00123027;
                      uVar22 = uVar22 + 1;
                    } while (uVar28 != uVar22);
                  }
                  n = iVar27 * 8 + 8;
                  iVar29 = sqlite3VdbeMemGrow(pMem,n,(uint)(iVar27 != 0));
                  *(int *)(pStmt + 0x38) = iVar29;
                  if (iVar29 != 0) goto LAB_00122e47;
                  plVar16 = (long *)pMem->z;
                  uVar28 = (ulong)(iVar27 + 1);
                  plVar16[iVar27] = *(long *)(pbVar30 + 0x10);
                  *(byte *)&pMem->flags = (byte)pMem->flags | 0x10;
                  pMem->n = n;
                  iVar14 = iVar14 + *(int *)(*(long *)(pbVar30 + 0x10) + 8);
                }
LAB_00123094:
                if ((*(ushort *)(pStmt + 0xc5) & 8) == 0) goto LAB_001230c5;
                if (*pbVar30 != 0x3d) goto LAB_001230b9;
                iVar27 = *(int *)(pStmt + 0x34);
                if (1 < iVar27) goto LAB_001230c5;
              } while( true );
            }
            sqlite3OomFault(psVar3);
LAB_00122e47:
            uVar13 = 1;
            goto LAB_0012310b;
          }
          psVar2->nVdbeExec = psVar2->nVdbeExec + 1;
          uVar13 = sqlite3VdbeExec((Vdbe *)pStmt);
          psVar2->nVdbeExec = psVar2->nVdbeExec + -1;
          uVar15 = 100;
          if (uVar13 != 100) goto LAB_0012310b;
          goto LAB_0012321e;
        }
        if ((uVar12 & 3) == 0) {
          iVar14 = psVar2->nVdbeActive;
          if (iVar14 == 0) {
            (psVar2->u1).isInterrupted = 0;
          }
          if ((((psVar2->mTrace & 0x82) != 0) && ((psVar2->init).busy == '\0')) &&
             (*(long *)(pStmt + 0xf0) != 0)) {
            sqlite3OsCurrentTimeInt64(psVar2->pVfs,(sqlite3_int64 *)(pStmt + 0xb8));
            iVar14 = psVar2->nVdbeActive;
          }
          psVar2->nVdbeActive = iVar14 + 1;
          uVar12 = *(ushort *)(pStmt + 0xc5);
          if ((uVar12 >> 8 & 1) == 0) {
            psVar2->nVdbeWrite = psVar2->nVdbeWrite + 1;
            uVar12 = *(ushort *)(pStmt + 0xc5);
          }
          if ((uVar12 >> 9 & 1) != 0) {
            psVar2->nVdbeRead = psVar2->nVdbeRead + 1;
            uVar12 = *(ushort *)(pStmt + 0xc5);
          }
          *(undefined4 *)(pStmt + 0x34) = 0;
          goto LAB_00122dea;
        }
        *(undefined4 *)(pStmt + 0x38) = 0x11;
        uVar15 = 1;
        goto LAB_00123259;
      }
      goto LAB_00123a76;
    }
    pcVar19 = "API called with finalized prepared statement";
  }
  sqlite3_log(0x15,pcVar19);
  sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x14046,
              "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  return 0x15;
LAB_001230b9:
  if (*pbVar30 == 0xab) goto LAB_001230c5;
  goto LAB_00122f97;
LAB_001230c5:
  if ((psVar3->u1).isInterrupted != 0) {
    *(undefined4 *)(pStmt + 0x38) = 9;
    sqlite3VdbeError((Vdbe *)pStmt,"interrupted");
    uVar13 = 1;
    goto LAB_0012310b;
  }
  if ((*(ushort *)(pStmt + 0xc5) & 0xc) == 4) {
    *(undefined2 *)(lVar31 + 0x40) = 4;
    *(long *)(lVar31 + 0x38) = (long)iVar21;
    *(undefined2 *)(lVar31 + 0x78) = 0xa02;
    pcVar19 = *(char **)(sqlite3OpcodeName_azName + (ulong)*pbVar30 * 8);
    *(char **)(lVar31 + 0x80) = pcVar19;
    sVar17 = strlen(pcVar19);
    *(uint *)(lVar31 + 0x7c) = (uint)sVar17 & 0x3fffffff;
    *(undefined1 *)(lVar31 + 0x7a) = 1;
    p_02 = (Mem *)(lVar31 + 0xa8);
  }
  p_02->flags = 4;
  p_02->u = (MemValue)(long)*(int *)(pbVar30 + 4);
  p_02[1].flags = 4;
  p_02[1].u = (MemValue)(long)*(int *)(pbVar30 + 8);
  p_02[2].flags = 4;
  p_02[2].u = (MemValue)(long)*(int *)(pbVar30 + 0xc);
  uVar15 = p_02[3].szMalloc;
  if ((int)uVar15 < 100) {
    iVar14 = sqlite3VdbeMemGrow(p_02 + 3,100,0);
    uVar13 = 1;
    if (iVar14 != 0) goto LAB_0012310b;
    pcVar19 = p_02[3].z;
    uVar15 = p_02[3].szMalloc;
  }
  else {
    pcVar19 = p_02[3].zMalloc;
    p_02[3].z = pcVar19;
  }
  p_02[3].flags = 0x202;
  local_158[0].db = (sqlite3 *)0x0;
  local_158[0].mxAlloc = 0;
  local_158[0].nChar = 0;
  local_158[0].accError = '\0';
  local_158[0].printfFlags = '\0';
  pcVar26 = pcVar19;
  local_158[0].zText = pcVar19;
  local_158[0].nAlloc = uVar15;
  switch(pbVar30[1]) {
  case 0xef:
  case 0xfb:
    *pcVar19 = '\0';
    break;
  default:
    pcVar26 = *(char **)(pbVar30 + 0x10);
    if (*(char **)(pbVar30 + 0x10) == (char *)0x0) {
      *pcVar19 = '\0';
      pcVar26 = pcVar19;
    }
    break;
  case 0xf1:
    puVar5 = *(uint **)(pbVar30 + 0x10);
    uVar15 = *puVar5;
    if ((int)uVar15 < 1) {
      uVar33 = 0;
    }
    else {
      lVar31 = 1;
      do {
        sqlite3_str_appendf(local_158,",%d",(ulong)puVar5[lVar31]);
        lVar31 = lVar31 + 1;
      } while ((ulong)uVar15 + 1 != lVar31);
      uVar33 = local_158[0].nChar;
    }
    *pcVar19 = '[';
    if (uVar33 + 1 < local_158[0].nAlloc) {
      local_158[0].nChar = uVar33 + 1;
      local_158[0].zText[uVar33] = ']';
    }
    else {
      enlargeAndAppend(local_158,"]",1);
    }
    break;
  case 0xf2:
    puVar18 = *(undefined8 **)(pbVar30 + 0x10);
LAB_001235af:
    uVar25 = *puVar18;
    pcVar19 = "%lld";
    goto LAB_0012378c;
  case 0xf3:
    sqlite3_str_appendf(local_158,"%.16g",(int)**(undefined8 **)(pbVar30 + 0x10));
    break;
  case 0xf4:
    uVar25 = *(undefined8 *)(*(long *)(pbVar30 + 0x10) + 0x10);
    pcVar19 = "vtab:%p";
    goto LAB_0012378c;
  case 0xf5:
    puVar18 = *(undefined8 **)(pbVar30 + 0x10);
    uVar12 = *(ushort *)(puVar18 + 1);
    if ((uVar12 & 2) == 0) {
      if ((uVar12 & 4) != 0) goto LAB_001235af;
      if ((uVar12 & 8) == 0) {
        pcVar26 = "NULL";
        if ((uVar12 & 1) == 0) {
          pcVar26 = "(blob)";
        }
      }
      else {
        sqlite3_str_appendf(local_158,"%.16g",(int)*puVar18);
      }
    }
    else {
      pcVar26 = (char *)puVar18[2];
    }
    break;
  case 0xf7:
    lVar31 = *(long *)(pbVar30 + 0x10);
    sqlite3_str_appendf(local_158,"k(%d",(ulong)*(ushort *)(lVar31 + 6));
    if (*(short *)(lVar31 + 6) != 0) {
      uVar28 = 0;
      do {
        puVar18 = *(undefined8 **)(lVar31 + 0x20 + uVar28 * 8);
        pcVar19 = "";
        if (puVar18 != (undefined8 *)0x0) {
          pcVar19 = (char *)*puVar18;
        }
        iVar14 = strcmp(pcVar19,"BINARY");
        if (iVar14 == 0) {
          pcVar19 = "B";
        }
        pcVar24 = "-";
        if (*(char *)(*(long *)(lVar31 + 0x18) + uVar28) == '\0') {
          pcVar24 = "";
        }
        sqlite3_str_appendf(local_158,",%s%s",pcVar24,pcVar19);
        uVar28 = uVar28 + 1;
      } while (uVar28 < *(ushort *)(lVar31 + 6));
    }
    uVar28 = (ulong)local_158[0].nChar;
    if (local_158[0].nChar + 1 < local_158[0].nAlloc) {
      local_158[0].nChar = local_158[0].nChar + 1;
      local_158[0].zText[uVar28] = ')';
    }
    else {
      enlargeAndAppend(local_158,")",1);
    }
    break;
  case 0xf8:
    sqlite3_str_appendf(local_158,"%s(%d)",*(undefined8 *)(*(char **)(pbVar30 + 0x10) + 0x38),
                        (ulong)(uint)(int)**(char **)(pbVar30 + 0x10));
    break;
  case 0xfa:
    uVar25 = **(undefined8 **)(pbVar30 + 0x10);
    pcVar19 = "%s";
    goto LAB_0012378c;
  case 0xfc:
    sqlite3_str_appendf(local_158,"program");
    break;
  case 0xfd:
    sqlite3_str_appendf(local_158,"%d",(ulong)*(uint *)(pbVar30 + 0x10));
    break;
  case 0xfe:
    uVar25 = **(undefined8 **)(pbVar30 + 0x10);
    pcVar19 = "(%.20s)";
LAB_0012378c:
    sqlite3_str_appendf(local_158,pcVar19,uVar25);
  }
  sqlite3StrAccumFinish(local_158);
  if (pcVar26 == p_02[3].z) {
    if (pcVar26 == (char *)0x0) {
      uVar15 = 0;
    }
    else {
      sVar17 = strlen(p_02[3].z);
      uVar15 = (uint)sVar17 & 0x3fffffff;
    }
    p_02[3].n = uVar15;
    p_02[3].enc = '\x01';
  }
  else {
    p_02[3].n = 0;
    sqlite3VdbeMemSetStr(p_02 + 3,pcVar26,-1,'\x01',(_func_void_void_ptr *)0x0);
  }
  uVar12 = *(ushort *)(pStmt + 0xc5) & 0xc;
  if (uVar12 == 4) {
    if (3 < p_02[4].szMalloc) {
      pcVar19 = p_02[4].zMalloc;
      p_02[4].z = pcVar19;
LAB_0012385f:
      p_02[4].flags = 0x202;
      p_02[4].n = 2;
      sqlite3_snprintf(3,pcVar19,"%.2x",(ulong)*(ushort *)(pbVar30 + 2));
      p_02[4].enc = '\x01';
      p_02[5].flags = 1;
      uVar12 = *(ushort *)(pStmt + 0xc5) & 0xc;
      goto LAB_001238a9;
    }
    iVar14 = sqlite3VdbeMemGrow(p_02 + 4,4,0);
    uVar13 = 1;
    if (iVar14 == 0) {
      pcVar19 = p_02[4].z;
      goto LAB_0012385f;
    }
LAB_0012310b:
    if (0 < *(long *)(pStmt + 0xb8)) {
      invokeProfileCallback(psVar2,(Vdbe *)pStmt);
    }
    uVar15 = uVar13;
    if ((uVar13 == 0x65) && (uVar15 = 0x65, psVar2->autoCommit != '\0')) {
      if (psVar2->nDb < 1) {
        *(undefined4 *)(pStmt + 0x38) = 0;
      }
      else {
        lVar31 = 0;
        lVar32 = 0;
        iVar14 = 0;
        do {
          p_00 = *(Btree **)((long)&psVar2->aDb->pBt + lVar31);
          if (p_00 != (Btree *)0x0) {
            if ((p_00->sharable != '\0') &&
               (p_00->wantToLock = p_00->wantToLock + 1, p_00->locked == '\0')) {
              btreeLockCarefully(p_00);
            }
            pWVar4 = p_00->pBt->pPager->pWal;
            if (pWVar4 == (Wal *)0x0) {
              uVar33 = 0;
            }
            else {
              uVar33 = pWVar4->iCallback;
              pWVar4->iCallback = 0;
            }
            if (p_00->sharable != '\0') {
              piVar1 = &p_00->wantToLock;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                unlockBtreeMutex(p_00);
              }
            }
            if (((0 < (int)uVar33) &&
                (psVar2->xWalCallback != (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0)) &&
               (iVar14 == 0)) {
              iVar14 = (*psVar2->xWalCallback)
                                 (psVar2->pWalArg,psVar2,
                                  *(char **)((long)&psVar2->aDb->zDbSName + lVar31),uVar33);
            }
          }
          lVar32 = lVar32 + 1;
          lVar31 = lVar31 + 0x20;
        } while (lVar32 < psVar2->nDb);
        *(int *)(pStmt + 0x38) = iVar14;
        uVar15 = 1;
        if (iVar14 != 0) goto LAB_0012321e;
      }
      uVar15 = 0x65;
    }
  }
  else {
LAB_001238a9:
    *(ushort *)(pStmt + 0xc0) = uVar12 ^ 0xc;
    *(long *)(pStmt + 0xa0) = *(long *)(pStmt + 0x68) + 0x38;
    *(undefined4 *)(pStmt + 0x38) = 0;
    uVar15 = 100;
  }
LAB_0012321e:
  psVar2->errCode = uVar15;
  psVar3 = *(sqlite3 **)pStmt;
  if ((*(uint *)(pStmt + 0x38) == 0xc0a) || (psVar3->mallocFailed != '\0')) {
    apiOomError(psVar3);
LAB_00123249:
    *(undefined4 *)(pStmt + 0x38) = 7;
  }
  else if ((*(uint *)(pStmt + 0x38) & psVar3->errMask) == 7) goto LAB_00123249;
  if (uVar15 - 0x66 < 0xfffffffe) {
LAB_00123259:
    if ((char)pStmt[0xc4] < '\0') {
      uVar15 = sqlite3VdbeTransferError((Vdbe *)pStmt);
    }
  }
  uVar15 = uVar15 & psVar2->errMask;
  if (uVar15 != 0x11) goto LAB_00123a7a;
  if (local_18c == 0x32) {
    uVar15 = 0x11;
    goto LAB_00123a7a;
  }
  iVar14 = *(int *)(pStmt + 0x34);
  psVar2 = *(sqlite3 **)pStmt;
  uVar15 = sqlite3LockAndPrepare
                     (psVar2,*(char **)(pStmt + 0xf0),-1,(uint)(byte)pStmt[0xc4],(Vdbe *)pStmt,
                      (sqlite3_stmt **)&local_160,(char **)0x0);
  p_01 = local_160;
  if (uVar15 == 0) {
    local_18c = local_18c + 1;
    memcpy(local_158,local_160,0x128);
    memcpy(p_01,pStmt,0x128);
    memcpy(pStmt,local_158,0x128);
    pVVar7 = *(Vdbe **)(pStmt + 0x10);
    pVVar8 = p_01->pPrev;
    pVVar9 = p_01->pNext;
    p_01->pPrev = *(Vdbe **)(pStmt + 8);
    p_01->pNext = pVVar7;
    *(Vdbe **)(pStmt + 8) = pVVar8;
    *(Vdbe **)(pStmt + 0x10) = pVVar9;
    pcVar19 = p_01->zSql;
    p_01->zSql = *(char **)(pStmt + 0xf0);
    *(char **)(pStmt + 0xf0) = pcVar19;
    *(u32 *)(pStmt + 0x114) = p_01->expmask;
    pStmt[0xc4] = (sqlite3_stmt)p_01->prepFlags;
    uVar25 = *(undefined8 *)p_01->aCounter;
    uVar10 = *(undefined8 *)(p_01->aCounter + 2);
    uVar11 = *(undefined8 *)(p_01->aCounter + 5);
    *(undefined8 *)(pStmt + 0xdc) = *(undefined8 *)(p_01->aCounter + 3);
    *(undefined8 *)(pStmt + 0xe4) = uVar11;
    *(undefined8 *)(pStmt + 0xd0) = uVar25;
    *(undefined8 *)(pStmt + 0xd8) = uVar10;
    *(int *)(pStmt + 0xe4) = *(int *)(pStmt + 0xe4) + 1;
    sqlite3TransferBindings((sqlite3_stmt *)p_01,pStmt);
    p_01->rc = 0;
    sqlite3VdbeFinalize(p_01);
    sqlite3_reset(pStmt);
    if (-1 < iVar14) {
      pStmt[0xc5] = (sqlite3_stmt)((byte)pStmt[0xc5] | 0x10);
    }
    goto LAB_00122db2;
  }
  if (uVar15 == 7) {
    sqlite3OomFault(psVar2);
  }
  pcVar19 = (char *)sqlite3ValueText(db->pErr,'\x01');
  if (*(void **)(pStmt + 0xa8) != (void *)0x0) {
    sqlite3DbFreeNN(db,*(void **)(pStmt + 0xa8));
  }
  if (db->mallocFailed == '\0') {
    pcVar19 = sqlite3DbStrDup(db,pcVar19);
    *(char **)(pStmt + 0xa8) = pcVar19;
    if ((uVar15 != 0xc0a) && (db->mallocFailed == '\0')) {
      uVar15 = uVar15 & db->errMask;
      goto LAB_00123a76;
    }
    apiOomError(db);
  }
  else {
    *(undefined8 *)(pStmt + 0xa8) = 0;
  }
  uVar15 = 7;
LAB_00123a76:
  *(uint *)(pStmt + 0x38) = uVar15;
LAB_00123a7a:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar15;
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement. 
      ** The error message from the SQL compiler has already been loaded 
      ** into the database handle. This block copies the error message 
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is 
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ) v->doingRerun = 1;
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}